

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O1

bool testMethod_swap(void)

{
  undefined8 uVar1;
  undefined8 __s1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  ostream *poVar7;
  bool bVar8;
  String str2;
  String str1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  String local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"testMethod_swap()\n",0x12);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"1","");
  cm::String::String<std::__cxx11::string,void>(&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"2","");
  cm::String::String<std::__cxx11::string,void>((String *)&local_88,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = local_68.view_._M_str;
  sVar4 = local_68.view_._M_len;
  _Var3._M_pi = local_68.string_.
                super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  peVar2 = local_68.string_.
           super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  __s1 = local_88.field_2._8_8_;
  uVar1 = local_88.field_2._M_allocated_capacity;
  local_68.string_.
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_88._M_dataplus._M_p;
  local_68.string_.
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length;
  local_88._M_dataplus._M_p = (pointer)peVar2;
  local_88._M_string_length = (size_type)_Var3._M_pi;
  local_68.view_._M_len = local_88.field_2._M_allocated_capacity;
  local_68.view_._M_str = (char *)local_88.field_2._8_8_;
  local_88.field_2._M_allocated_capacity = sVar4;
  local_88.field_2._8_8_ = pcVar5;
  if (uVar1 == 1) {
    iVar6 = bcmp((void *)__s1,"2",1);
    if (iVar6 != 0) goto LAB_001c7f92;
    if (local_88.field_2._M_allocated_capacity == 1) {
      iVar6 = bcmp((void *)local_88.field_2._8_8_,"1",1);
      if (iVar6 == 0) {
        bVar8 = true;
        goto LAB_001c7fd3;
      }
    }
    iVar6 = 0x301;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str2 == \"1\") failed on line ",0x28);
  }
  else {
LAB_001c7f92:
    iVar6 = 0x300;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str1 == \"2\") failed on line ",0x28);
  }
  poVar7 = (ostream *)std::ostream::operator<<(&std::cout,iVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  bVar8 = false;
LAB_001c7fd3:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
  }
  if (local_68.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.string_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return bVar8;
}

Assistant:

static bool testMethod_front_back()
{
  std::cout << "testMethod_front_back()\n";
  cm::String str = "abc";
  ASSERT_TRUE(str.front() == 'a');
  ASSERT_TRUE(str.back() == 'c');
  return true;
}